

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredRenderCase::init
          (LayeredRenderCase *this,EVP_PKEY_CTX *ctx)

{
  GLuint *pGVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestLog *pTVar3;
  RenderContext *pRVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  bool bVar7;
  ContextType CVar8;
  int iVar9;
  deUint32 dVar10;
  int extraout_EAX;
  RenderTarget *pRVar11;
  undefined4 extraout_var;
  TextureFormat texFormat;
  TransferFormat TVar12;
  undefined4 extraout_var_00;
  ShaderProgram *pSVar13;
  pointer pcVar14;
  void *pvVar15;
  ostream *poVar16;
  ostream *poVar17;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  NotSupportedError *pNVar18;
  long *plVar19;
  TestError *pTVar20;
  int iVar21;
  size_type *psVar22;
  long lVar23;
  undefined4 uVar24;
  char *pcVar25;
  undefined4 uVar26;
  undefined8 uVar27;
  ulong uVar28;
  int iVar29;
  size_type __dnew_1;
  value_type local_3b8;
  GLuint *local_398;
  ContextType local_38c;
  string local_388;
  int numSamples;
  value_type local_360;
  ScopedLogSection section;
  int maxSamples;
  undefined4 uStack_334;
  undefined1 local_330 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  string local_310;
  string local_2f0;
  ContextType local_2cc;
  size_type __dnew_2;
  pointer local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8 [6];
  ios_base local_258 [8];
  ios_base local_250 [264];
  ScopedLogSection section_1;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  string local_128;
  ContextType local_104;
  size_type __dnew;
  pointer local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0 [8];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  undefined1 local_50 [32];
  
  CVar8.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar7 = glu::contextSupports(CVar8,(ApiType)0x23);
  if ((!bVar7) &&
     (bVar7 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_geometry_shader")
     , !bVar7)) {
    pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar18,"Tests require GL_EXT_geometry_shader extension or higher context version.",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
               ,0xaca);
LAB_003a9c88:
    __cxa_throw(pNVar18,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (this->m_target == TARGET_2D_MS_ARRAY) {
    CVar8.super_ApiType.m_bits =
         (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    bVar7 = glu::contextSupports(CVar8,(ApiType)0x23);
    if ((!bVar7) &&
       (bVar7 = glu::ContextInfo::isExtensionSupported
                          (((this->super_TestCase).m_context)->m_contextInfo,
                           "GL_OES_texture_storage_multisample_2d_array"), !bVar7)) {
      pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar18,
                 "Test requires OES_texture_storage_multisample_2d_array extension or higher context version."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                 ,0xacd);
      goto LAB_003a9c88;
    }
  }
  pRVar11 = Context::getRenderTarget((this->super_TestCase).m_context);
  if ((pRVar11->m_width < (this->m_resolveDimensions).m_data[0]) ||
     (pRVar11 = Context::getRenderTarget((this->super_TestCase).m_context),
     pRVar11->m_height < (this->m_resolveDimensions).m_data[1])) {
    pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_2f0._M_dataplus._M_p._0_4_ = (this->m_resolveDimensions).m_data[0];
    de::toString<int>((string *)&numSamples,(int *)&local_2f0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__dnew_1,
                   "Render target size must be at least ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&numSamples)
    ;
    plVar19 = (long *)std::__cxx11::string::append((char *)&__dnew_1);
    __dnew = *plVar19;
    psVar22 = (size_type *)(plVar19 + 2);
    if ((size_type *)__dnew == psVar22) {
      local_f0[0]._0_8_ = *psVar22;
      local_f0[0]._8_8_ = plVar19[3];
      __dnew = (size_type)local_f0;
    }
    else {
      local_f0[0]._0_8_ = *psVar22;
    }
    local_f8 = (pointer)plVar19[1];
    *plVar19 = (long)psVar22;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    local_310._M_dataplus._M_p._0_4_ = (this->m_resolveDimensions).m_data[1];
    de::toString<int>((string *)&maxSamples,(int *)&local_310);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__dnew_2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__dnew,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&maxSamples)
    ;
    tcu::NotSupportedError::NotSupportedError(pNVar18,(string *)&__dnew_2);
    __cxa_throw(pNVar18,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  switch(this->m_test) {
  case TEST_DEFAULT_LAYER:
    __dnew_2 = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Rendering to the default layer.",0x1f);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&__dnew_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_SINGLE_LAYER:
    __dnew_2 = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Rendering to a single layer.",0x1c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&__dnew_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_ALL_LAYERS:
    __dnew_2 = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Rendering to all layers.",0x18);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&__dnew_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_DIFFERENT_LAYERS:
    __dnew_2 = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Outputting different number of vertices to each layer.",0x36);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&__dnew_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_INVOCATION_PER_LAYER:
    __dnew_2 = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Using a different invocation to output to each layer.",0x35);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&__dnew_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_MULTIPLE_LAYERS_PER_INVOCATION:
    __dnew_2 = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Outputting to each layer from multiple invocations.",0x33);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&__dnew_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_LAYER_ID:
    __dnew_2 = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Using gl_Layer in fragment shader.",0x22);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&__dnew_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_LAYER_PROVOKING_VERTEX:
    __dnew_2 = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Verifying LAYER_PROVOKING_VERTEX.",0x21);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&__dnew_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  default:
    goto switchD_003a8046_default;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2c0);
  std::ios_base::~ios_base(local_250);
switchD_003a8046_default:
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar23 = CONCAT44(extraout_var,iVar9);
  uVar28 = (ulong)this->m_target;
  iVar29 = 0;
  iVar9 = 0;
  iVar21 = 0;
  if (uVar28 < 5) {
    iVar9 = *(int *)(&DAT_00946790 + uVar28 * 4);
    iVar21 = *(int *)(&DAT_00946740 + uVar28 * 4);
    iVar29 = 0x40;
  }
  texFormat = glu::mapGLInternalFormat(0x8058);
  TVar12 = glu::getTransferFormat(texFormat);
  pGVar1 = &this->m_texture;
  (**(code **)(lVar23 + 0x6f8))(1,pGVar1);
  dVar10 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar10,"gen texture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xb6f);
  if (TARGET_2D_MS_ARRAY < this->m_target) goto LAB_003a88c4;
  uVar28 = (ulong)TVar12 >> 0x20;
  local_398 = pGVar1;
  switch(this->m_target) {
  case TARGET_CUBE:
    __dnew_2 = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Creating cubemap texture, size = ",0x21);
    std::ostream::operator<<((ostringstream *)&local_2c0,iVar29);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2c0,"x",1);
    std::ostream::operator<<((ostringstream *)&local_2c0,iVar9);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&__dnew_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2c0);
    std::ios_base::~ios_base(local_250);
    (**(code **)(lVar23 + 0xb8))(0x8513,*local_398);
    (**(code **)(lVar23 + 0x1310))(0x8515,0,0x8058,iVar29,iVar9,0,TVar12,uVar28,0);
    (**(code **)(lVar23 + 0x1310))(0x8516,0,0x8058,iVar29,iVar9,0,TVar12,uVar28,0);
    (**(code **)(lVar23 + 0x1310))(0x8517,0,0x8058,iVar29,iVar9,0,TVar12,uVar28,0);
    (**(code **)(lVar23 + 0x1310))(0x8518,0,0x8058,iVar29,iVar9,0,TVar12,uVar28,0);
    (**(code **)(lVar23 + 0x1310))(0x8519,0,0x8058,iVar29,iVar9,0,TVar12,uVar28,0);
    uVar27 = 0x851a;
    break;
  case TARGET_3D:
    __dnew_2 = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Creating 3d texture, size = ",0x1c);
    std::ostream::operator<<((ostringstream *)&local_2c0,iVar29);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2c0,"x",1);
    std::ostream::operator<<((ostringstream *)&local_2c0,iVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2c0,"x",1);
    std::ostream::operator<<((ostringstream *)&local_2c0,iVar21);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&__dnew_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2c0);
    std::ios_base::~ios_base(local_250);
    (**(code **)(lVar23 + 0xb8))(0x806f,*local_398);
    uVar27 = 0x806f;
    goto LAB_003a889e;
  case TARGET_1D_ARRAY:
    __dnew_2 = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Creating 1d texture array, size = ",0x22);
    std::ostream::operator<<((ostringstream *)&local_2c0,iVar29);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2c0,", layers = ",0xb);
    std::ostream::operator<<((ostringstream *)&local_2c0,iVar9);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&__dnew_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2c0);
    std::ios_base::~ios_base(local_250);
    (**(code **)(lVar23 + 0xb8))(0x8c18,*local_398);
    uVar27 = 0x8c18;
    break;
  case TARGET_2D_ARRAY:
    __dnew_2 = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Creating 2d texture array, size = ",0x22);
    std::ostream::operator<<((ostringstream *)&local_2c0,iVar29);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2c0,"x",1);
    std::ostream::operator<<((ostringstream *)&local_2c0,iVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2c0,", layers = ",0xb);
    std::ostream::operator<<((ostringstream *)&local_2c0,iVar21);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&__dnew_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2c0);
    std::ios_base::~ios_base(local_250);
    (**(code **)(lVar23 + 0xb8))(0x8c1a,*local_398);
    uVar27 = 0x8c1a;
LAB_003a889e:
    (**(code **)(lVar23 + 0x1320))(uVar27,0,0x8058,iVar29,iVar9,iVar21,0,TVar12,uVar28,0);
    goto LAB_003a88c4;
  case TARGET_2D_MS_ARRAY:
    numSamples = 2;
    _maxSamples = _maxSamples & 0xffffffff00000000;
    (**(code **)(lVar23 + 0x868))(0x910e);
    __dnew_2 = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Creating 2d multisample texture array, size = ",0x2e);
    std::ostream::operator<<((ostringstream *)&local_2c0,iVar29);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2c0,"x",1);
    std::ostream::operator<<((ostringstream *)&local_2c0,iVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2c0,", layers = ",0xb);
    std::ostream::operator<<((ostringstream *)&local_2c0,iVar21);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2c0,", samples = ",0xc);
    std::ostream::operator<<((ostringstream *)&local_2c0,2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&__dnew_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2c0);
    std::ios_base::~ios_base(local_250);
    if (maxSamples < 2) {
      pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      de::toString<int>((string *)&__dnew_1,&numSamples);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__dnew,
                     "Test requires ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__dnew_1)
      ;
      plVar19 = (long *)std::__cxx11::string::append((char *)&__dnew);
      __dnew_2 = *plVar19;
      psVar22 = (size_type *)(plVar19 + 2);
      if ((size_type *)__dnew_2 == psVar22) {
        local_2b8[0]._0_8_ = *psVar22;
        local_2b8[0]._8_8_ = plVar19[3];
        __dnew_2 = (size_type)local_2b8;
      }
      else {
        local_2b8[0]._0_8_ = *psVar22;
      }
      local_2c0 = (pointer)plVar19[1];
      *plVar19 = (long)psVar22;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      tcu::NotSupportedError::NotSupportedError(pNVar18,(string *)&__dnew_2);
      __cxa_throw(pNVar18,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar23 + 0xb8))(0x9102,*local_398);
    (**(code **)(lVar23 + 0x13a8))(0x9102,2,0x8058,iVar29,iVar9,iVar21,1);
    goto LAB_003a88c4;
  }
  (**(code **)(lVar23 + 0x1310))(uVar27,0,0x8058,iVar29,iVar9,0,TVar12,uVar28,0);
LAB_003a88c4:
  dVar10 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar10,"tex image",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xba4);
  switch(this->m_target) {
  case TARGET_CUBE:
    uVar27 = 0x8513;
    break;
  case TARGET_3D:
    uVar27 = 0x806f;
    break;
  case TARGET_1D_ARRAY:
    uVar27 = 0x8c18;
    break;
  case TARGET_2D_ARRAY:
    uVar27 = 0x8c1a;
    break;
  case TARGET_2D_MS_ARRAY:
    goto switchD_003a88fc_caseD_4;
  default:
    uVar27 = 0;
  }
  (**(code **)(lVar23 + 0x1360))(uVar27,0x2800,0x2600);
  uVar24 = 0;
  uVar26 = 0;
  if ((ulong)this->m_target < 5) {
    uVar26 = *(undefined4 *)(&DAT_009467a4 + (ulong)this->m_target * 4);
  }
  (**(code **)(lVar23 + 0x1360))(uVar26,0x2801,0x2600);
  if ((ulong)this->m_target < 5) {
    uVar24 = *(undefined4 *)(&DAT_009467a4 + (ulong)this->m_target * 4);
  }
  (**(code **)(lVar23 + 0x1360))(uVar24,0x2802,0x2901);
  uVar24 = 0;
  uVar26 = 0;
  if ((ulong)this->m_target < 5) {
    uVar26 = *(undefined4 *)(&DAT_009467a4 + (ulong)this->m_target * 4);
  }
  (**(code **)(lVar23 + 0x1360))(uVar26,0x2803,0x2901);
  if ((ulong)this->m_target < 5) {
    uVar24 = *(undefined4 *)(&DAT_009467a4 + (ulong)this->m_target * 4);
  }
  (**(code **)(lVar23 + 0x1360))(uVar24,0x8072,0x2901);
  dVar10 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar10,"tex filter",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xbae);
switchD_003a88fc_caseD_4:
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar23 = CONCAT44(extraout_var_00,iVar9);
  __dnew_2 = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2c0,"Creating FBO",0xc);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&__dnew_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2c0);
  std::ios_base::~ios_base(local_250);
  (**(code **)(lVar23 + 0x6d0))(1,&this->m_fbo);
  (**(code **)(lVar23 + 0x78))(0x8d40,this->m_fbo);
  (**(code **)(lVar23 + 0x690))(0x8d40,0x8ce0,this->m_texture,0);
  (**(code **)(lVar23 + 0x78))(0x8d40,0);
  dVar10 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar10,"setup fbo",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xbbf);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  __dnew_2 = (size_type)local_2b8;
  __dnew = 0x15;
  __dnew_2 = std::__cxx11::string::_M_create(&__dnew_2,(ulong)&__dnew);
  local_2b8[0]._M_allocated_capacity = __dnew;
  builtin_strncpy((char *)__dnew_2,"RenderToTextureShader",0x15);
  local_2c0 = (pointer)__dnew;
  *(char *)(__dnew_2 + __dnew) = '\0';
  __dnew_1 = 0x27;
  __dnew = (size_type)local_f0;
  __dnew = std::__cxx11::string::_M_create(&__dnew,(ulong)&__dnew_1);
  local_f0[0]._M_allocated_capacity = __dnew_1;
  builtin_strncpy((char *)__dnew,"Create layered rendering shader program",0x27);
  local_f8 = (pointer)__dnew_1;
  *(char *)(__dnew + __dnew_1) = '\0';
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar3,(string *)&__dnew_2,(string *)&__dnew);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew != local_f0) {
    operator_delete((void *)__dnew,local_f0[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew_2 != local_2b8) {
    operator_delete((void *)__dnew_2,local_2b8[0]._M_allocated_capacity + 1);
  }
  pSVar13 = (ShaderProgram *)operator_new(0xd0);
  pRVar4 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&__dnew,0,0xac);
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  local_50[0x10] = 0;
  local_50._17_8_ = 0;
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  __dnew_2 = 0x53;
  pcVar14 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_388,(ulong)&__dnew_2);
  sVar6 = __dnew_2;
  local_388.field_2._M_allocated_capacity = __dnew_2;
  local_388._M_dataplus._M_p = pcVar14;
  memcpy(pcVar14,
         "${GLSL_VERSION_DECL}\nvoid main (void)\n{\n\tgl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n}\n"
         ,0x53);
  local_388._M_string_length = sVar6;
  pcVar14[sVar6] = '\0';
  local_104.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  specializeShader(&local_310,&local_388,&local_104);
  __dnew_1 = __dnew_1 & 0xffffffff00000000;
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3b8,local_310._M_dataplus._M_p,
             local_310._M_dataplus._M_p + local_310._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(&__dnew + (__dnew_1 & 0xffffffff) * 3),&local_3b8);
  local_38c.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  if (this->m_test == TEST_LAYER_ID) {
    __dnew_2 = (size_type)local_2b8;
    _maxSamples = (pointer)0x12d;
    pvVar15 = (void *)std::__cxx11::string::_M_create(&__dnew_2,(ulong)&maxSamples);
    _Var5._M_p = _maxSamples;
    local_2b8[0]._M_allocated_capacity = _maxSamples;
    __dnew_2 = (size_type)pvVar15;
    memcpy(pvVar15,
           "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(((gl_Layer % 2) == 1) ? 1.0 : 0.5,\n\t                 (((gl_Layer / 2) % 2) == 1) ? 1.0 : 0.5,\n\t                 (gl_Layer == 0) ? 1.0 : 0.0,\n\t                 1.0);\n}\n"
           ,0x12d);
    local_2c0 = _Var5._M_p;
    *((long)pvVar15 + _Var5._M_p) = '\0';
    specializeShader((string *)&section_1,(string *)&__dnew_2,&local_38c);
  }
  else {
    __dnew_2 = (size_type)local_2b8;
    _maxSamples = (pointer)0x9c;
    pvVar15 = (void *)std::__cxx11::string::_M_create(&__dnew_2,(ulong)&maxSamples);
    _Var5._M_p = _maxSamples;
    local_2b8[0]._M_allocated_capacity = _maxSamples;
    __dnew_2 = (size_type)pvVar15;
    memcpy(pvVar15,
           "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nin mediump vec4 v_frag_FragColor;\nvoid main (void)\n{\n\tfragColor = v_frag_FragColor;\n}\n"
           ,0x9c);
    local_2c0 = _Var5._M_p;
    *((long)pvVar15 + _Var5._M_p) = '\0';
    specializeShader((string *)&section_1,(string *)&__dnew_2,&local_38c);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew_2 != local_2b8) {
    operator_delete((void *)__dnew_2,local_2b8[0]._M_allocated_capacity + 1);
  }
  numSamples = 1;
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_360,section_1.m_log,(long)&(section_1.m_log)->m_log + local_140);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(&__dnew + (ulong)(uint)numSamples * 3),&local_360);
  local_2cc.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  switch(this->m_test) {
  case TEST_ALL_LAYERS:
  case TEST_LAYER_ID:
    iVar9 = this->m_numLayers << 2;
    break;
  case TEST_DIFFERENT_LAYERS:
    iVar9 = (this->m_numLayers + 1) * this->m_numLayers;
    break;
  default:
    iVar9 = (uint)(this->m_test == TEST_LAYER_PROVOKING_VERTEX) * 2 + 4;
    break;
  case TEST_MULTIPLE_LAYERS_PER_INVOCATION:
    iVar9 = 6;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&__dnew_2);
  poVar16 = (ostream *)&__dnew_2;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar16,"${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}",0x30);
  if ((this->m_test & ~TEST_SINGLE_LAYER) == TEST_INVOCATION_PER_LAYER) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&__dnew_2,"layout(points, invocations=",0x1b);
    poVar16 = (ostream *)std::ostream::operator<<(&__dnew_2,this->m_numLayers);
    lVar23 = 6;
    pcVar25 = ") in;\n";
  }
  else {
    lVar23 = 0x13;
    pcVar25 = "layout(points) in;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar25,lVar23);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&__dnew_2,"layout(triangle_strip, max_vertices = ",0x26);
  poVar16 = (ostream *)&__dnew_2;
  poVar17 = (ostream *)std::ostream::operator<<(poVar16,iVar9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar17,") out;\nout highp vec4 v_frag_FragColor;\n\nvoid main (void)\n{\n",0x3c);
  switch(this->m_test) {
  case TEST_DEFAULT_LAYER:
    lVar23 = 0x18c;
    pcVar25 = 
    "\tconst highp vec4 white = vec4(1.0, 1.0, 1.0, 1.0);\n\n\tgl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n\tv_frag_FragColor = white;\n\tEmitVertex();\n"
    ;
    break;
  case TEST_SINGLE_LAYER:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&__dnew_2,
               "\tconst highp vec4 white = vec4(1.0, 1.0, 1.0, 1.0);\n\n\tgl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n\tgl_Layer = "
               ,0x6c);
    poVar16 = (ostream *)std::ostream::operator<<(&__dnew_2,this->m_targetLayer);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,
               ";\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n\tgl_Layer = "
               ,100);
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,this->m_targetLayer);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,
               ";\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n\tgl_Layer = "
               ,100);
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,this->m_targetLayer);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,
               ";\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n\tgl_Layer = "
               ,100);
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,this->m_targetLayer);
    lVar23 = 0x2c;
    pcVar25 = ";\n\tv_frag_FragColor = white;\n\tEmitVertex();\n";
    break;
  case TEST_ALL_LAYERS:
  case TEST_LAYER_ID:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&__dnew_2,
               "\tconst highp vec4 white   = vec4(1.0, 1.0, 1.0, 1.0);\n\tconst highp vec4 red     = vec4(1.0, 0.0, 0.0, 1.0);\n\tconst highp vec4 green   = vec4(0.0, 1.0, 0.0, 1.0);\n\tconst highp vec4 blue    = vec4(0.0, 0.0, 1.0, 1.0);\n\tconst highp vec4 yellow  = vec4(1.0, 1.0, 0.0, 1.0);\n\tconst highp vec4 magenta = vec4(1.0, 0.0, 1.0, 1.0);\n\tconst highp vec4 colors[6] = vec4[6](white, red, green, blue, yellow, magenta);\n\n\tfor (mediump int layerNdx = 0; layerNdx < "
               ,0x1c1);
    poVar16 = (ostream *)std::ostream::operator<<(&__dnew_2,this->m_numLayers);
    lVar23 = 0x211;
    pcVar25 = 
    "; ++layerNdx)\n\t{\n\t\tgl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n\t\tgl_Layer = layerNdx;\n\t\tv_frag_FragColor = colors[layerNdx];\n\t\tEmitVertex();\n\n\t\tgl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n\t\tgl_Layer = layerNdx;\n\t\tv_frag_FragColor = colors[layerNdx];\n\t\tEmitVertex();\n\n\t\tgl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n\t\tgl_Layer = layerNdx;\n\t\tv_frag_FragColor = colors[layerNdx];\n\t\tEmitVertex();\n\n\t\tgl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n\t\tgl_Layer = layerNdx;\n\t\tv_frag_FragColor = colors[layerNdx];\n\t\tEmitVertex();\n\t\tEndPrimitive();\n\t}\n"
    ;
    break;
  case TEST_DIFFERENT_LAYERS:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&__dnew_2,
               "\tconst highp vec4 white = vec4(1.0, 1.0, 1.0, 1.0);\n\n\tfor (mediump int layerNdx = 0; layerNdx < "
               ,0x60);
    poVar16 = (ostream *)std::ostream::operator<<(&__dnew_2,this->m_numLayers);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,
               "; ++layerNdx)\n\t{\n\t\tfor (mediump int colNdx = 0; colNdx <= layerNdx; ++colNdx)\n\t\t{\n\t\t\thighp float posX = float(colNdx) / float("
               ,0x7e);
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,this->m_numLayers);
    lVar23 = 0x110;
    pcVar25 = 
    ") * 2.0 - 1.0;\n\n\t\t\tgl_Position = vec4(posX,  1.0, 0.0, 1.0);\n\t\t\tgl_Layer = layerNdx;\n\t\t\tv_frag_FragColor = white;\n\t\t\tEmitVertex();\n\n\t\t\tgl_Position = vec4(posX, -1.0, 0.0, 1.0);\n\t\t\tgl_Layer = layerNdx;\n\t\t\tv_frag_FragColor = white;\n\t\t\tEmitVertex();\n\t\t}\n\t\tEndPrimitive();\n\t}\n"
    ;
    break;
  case TEST_INVOCATION_PER_LAYER:
    lVar23 = 0x3ba;
    pcVar25 = 
    "\tconst highp vec4 white   = vec4(1.0, 1.0, 1.0, 1.0);\n\tconst highp vec4 red     = vec4(1.0, 0.0, 0.0, 1.0);\n\tconst highp vec4 green   = vec4(0.0, 1.0, 0.0, 1.0);\n\tconst highp vec4 blue    = vec4(0.0, 0.0, 1.0, 1.0);\n\tconst highp vec4 yellow  = vec4(1.0, 1.0, 0.0, 1.0);\n\tconst highp vec4 magenta = vec4(1.0, 0.0, 1.0, 1.0);\n\tconst highp vec4 colors[6] = vec4[6](white, red, green, blue, yellow, magenta);\n\n\tgl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n\tgl_Layer = gl_InvocationID;\n\tv_frag_FragColor = colors[gl_InvocationID];\n\tEmitVertex();\n\n\tgl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n\tgl_Layer = gl_InvocationID;\n\tv_frag_FragColor = colors[gl_InvocationID];\n\tEmitVertex();\n\n\tgl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n\tgl_Layer = gl_InvocationID;\n\tv_frag_FragColor = colors[gl_InvocationID];\n\tEmitVertex();\n\n\tgl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n\tgl_Layer = gl_InvocationID;\n\tv_frag_FragColor = colors[gl_InvocationID];\n\tEmitVertex();\n\tEndPrimitive();\n"
    ;
    break;
  case TEST_MULTIPLE_LAYERS_PER_INVOCATION:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&__dnew_2,
               "\tconst highp vec4 white = vec4(1.0, 1.0, 1.0, 1.0);\n\n\tmediump int layerA = gl_InvocationID;\n\tmediump int layerB = (gl_InvocationID + 1) % "
               ,0x8a);
    poVar16 = (ostream *)std::ostream::operator<<(&__dnew_2,this->m_numLayers);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,";\n\thighp float aEnd = float(layerA) / float(",0x2c);
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,this->m_numLayers);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,") * 2.0 - 1.0;\n\thighp float bEnd = float(layerB) / float(",0x39);
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,this->m_numLayers);
    lVar23 = 0x2af;
    pcVar25 = 
    ") * 2.0 - 1.0;\n\n\tgl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n\tgl_Layer = layerA;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n\tgl_Layer = layerA;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4(aEnd, -1.0, 0.0, 1.0);\n\tgl_Layer = layerA;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tEndPrimitive();\n\n\tgl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n\tgl_Layer = layerB;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4(bEnd,  1.0, 0.0, 1.0);\n\tgl_Layer = layerB;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4(bEnd, -1.0, 0.0, 1.0);\n\tgl_Layer = layerB;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tEndPrimitive();\n"
    ;
    break;
  case TEST_LAYER_PROVOKING_VERTEX:
    lVar23 = 0x2a4;
    pcVar25 = 
    "\tconst highp vec4 white = vec4(1.0, 1.0, 1.0, 1.0);\n\n\tgl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n\tgl_Layer = 0;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n\tgl_Layer = 1;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n\tgl_Layer = 1;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tEndPrimitive();\n\n\tgl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n\tgl_Layer = 0;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n\tgl_Layer = 1;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n\n\tgl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n\tgl_Layer = 1;\n\tv_frag_FragColor = white;\n\tEmitVertex();\n"
    ;
    break;
  default:
    goto switchD_003a8fcf_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar25,lVar23);
switchD_003a8fcf_default:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&__dnew_2,"}\n",2);
  std::__cxx11::stringbuf::str();
  specializeShader(&local_128,&local_2f0,&local_2cc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_2f0._M_dataplus._M_p._4_4_,(int)local_2f0._M_dataplus._M_p) !=
      &local_2f0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_2f0._M_dataplus._M_p._4_4_,(int)local_2f0._M_dataplus._M_p),
                    local_2f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__dnew_2);
  std::ios_base::~ios_base(local_258);
  maxSamples = 2;
  local_330._0_8_ = &local_320;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_330,
             CONCAT44(local_128._M_dataplus._M_p._4_4_,(int)local_128._M_dataplus._M_p),
             local_128._M_string_length +
             CONCAT44(local_128._M_dataplus._M_p._4_4_,(int)local_128._M_dataplus._M_p));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(&__dnew + ((ulong)_maxSamples & 0xffffffff) * 3),(value_type *)local_330);
  glu::ShaderProgram::ShaderProgram(pSVar13,pRVar4,(ProgramSources *)&__dnew);
  this->m_renderShader = pSVar13;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._0_8_ != &local_320) {
    operator_delete((void *)local_330._0_8_,local_320._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_128._M_dataplus._M_p._4_4_,(int)local_128._M_dataplus._M_p) !=
      &local_128.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_128._M_dataplus._M_p._4_4_,(int)local_128._M_dataplus._M_p),
                    local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)section_1.m_log != &local_138) {
    operator_delete(section_1.m_log,local_138._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._0_8_ + 1);
  }
  paVar2 = &local_310.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != paVar2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_70);
  lVar23 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&__dnew + lVar23));
    lVar23 = lVar23 + -0x18;
  } while (lVar23 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_renderShader);
  if ((this->m_renderShader->m_program).m_info.linkOk == false) {
    pTVar20 = (TestError *)__cxa_allocate_exception(0x38);
    __dnew_2 = (size_type)local_2b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&__dnew_2,"failed to build render shader","");
    tcu::TestError::TestError(pTVar20,(string *)&__dnew_2);
    __cxa_throw(pTVar20,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  tcu::TestLog::endSection((TestLog *)CONCAT44(section.m_log._4_4_,(int)section.m_log));
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  __dnew_2 = (size_type)local_2b8;
  __dnew = 0x14;
  __dnew_2 = std::__cxx11::string::_M_create(&__dnew_2,(ulong)&__dnew);
  local_2b8[0]._M_allocated_capacity = __dnew;
  builtin_strncpy((char *)__dnew_2,"TextureSamplerShader",0x14);
  local_2c0 = (pointer)__dnew;
  *(char *)(__dnew_2 + __dnew) = '\0';
  __dnew_1 = 0x1d;
  __dnew = (size_type)local_f0;
  __dnew = std::__cxx11::string::_M_create(&__dnew,(ulong)&__dnew_1);
  local_f0[0]._M_allocated_capacity = __dnew_1;
  builtin_strncpy((char *)__dnew,"Create shader sampler program",0x1d);
  local_f8 = (pointer)__dnew_1;
  *(char *)(__dnew + __dnew_1) = '\0';
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar3,(string *)&__dnew_2,(string *)&__dnew);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew != local_f0) {
    operator_delete((void *)__dnew,local_f0[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew_2 != local_2b8) {
    operator_delete((void *)__dnew_2,local_2b8[0]._M_allocated_capacity + 1);
  }
  pSVar13 = (ShaderProgram *)operator_new(0xd0);
  pRVar4 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&__dnew,0,0xac);
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  local_50[0x10] = 0;
  local_50._17_8_ = 0;
  __dnew_2 = 0x5f;
  local_310._M_dataplus._M_p = (pointer)paVar2;
  pcVar14 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_310,(ulong)&__dnew_2);
  sVar6 = __dnew_2;
  local_310.field_2._M_allocated_capacity = __dnew_2;
  local_310._M_dataplus._M_p = pcVar14;
  memcpy(pcVar14,
         "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
         ,0x5f);
  local_310._M_string_length = sVar6;
  pcVar14[sVar6] = '\0';
  local_128._M_dataplus._M_p._0_4_ =
       (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  specializeShader(&local_2f0,&local_310,(ContextType *)&local_128);
  __dnew_1 = __dnew_1 & 0xffffffff00000000;
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3b8,
             CONCAT44(local_2f0._M_dataplus._M_p._4_4_,(int)local_2f0._M_dataplus._M_p),
             local_2f0._M_string_length +
             CONCAT44(local_2f0._M_dataplus._M_p._4_4_,(int)local_2f0._M_dataplus._M_p));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(&__dnew + (__dnew_1 & 0xffffffff) * 3),&local_3b8);
  section.m_log._0_4_ = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])()
  ;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&__dnew_2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&__dnew_2,"${GLSL_VERSION_DECL}\n",0x15);
  if (this->m_target == TARGET_2D_MS_ARRAY) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&__dnew_2,"${GLSL_OES_TEXTURE_STORAGE_MULTISAMPLE}",0x27);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&__dnew_2,"layout(location = 0) out mediump vec4 fragColor;\n",0x31);
  uVar28 = (ulong)this->m_target;
  if (uVar28 < 5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&__dnew_2,&DAT_00946754 + *(int *)(&DAT_00946754 + uVar28 * 4),
               *(long *)(&DAT_00946768 + uVar28 * 8));
  }
  poVar16 = (ostream *)&__dnew_2;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar16,"uniform highp int u_layer;\nvoid main (void)\n{\n",0x2e);
  switch(this->m_target) {
  case TARGET_CUBE:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&__dnew_2,"\thighp vec2 facepos = 2.0 * gl_FragCoord.xy / vec2(ivec2(",
               0x39);
    poVar16 = (ostream *)std::ostream::operator<<(&__dnew_2,(this->m_resolveDimensions).m_data[0]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,(this->m_resolveDimensions).m_data[1]);
    lVar23 = 0x29a;
    pcVar25 = 
    ")) - vec2(1.0, 1.0);\n\tif (u_layer == 0)\n\t\tfragColor = textureLod(u_sampler, vec3(1.0, -facepos.y, -facepos.x), 0.0);\n\telse if (u_layer == 1)\n\t\tfragColor = textureLod(u_sampler, vec3(-1.0, -facepos.y, facepos.x), 0.0);\n\telse if (u_layer == 2)\n\t\tfragColor = textureLod(u_sampler, vec3(facepos.x, 1.0, facepos.y), 0.0);\n\telse if (u_layer == 3)\n\t\tfragColor = textureLod(u_sampler, vec3(facepos.x, -1.0, -facepos.y), 0.0);\n\telse if (u_layer == 4)\n\t\tfragColor = textureLod(u_sampler, vec3(facepos.x, -facepos.y, 1.0), 0.0);\n\telse if (u_layer == 5)\n\t\tfragColor = textureLod(u_sampler, vec3(-facepos.x, -facepos.y, -1.0), 0.0);\n\telse\n\t\tfragColor = vec4(1.0, 0.0, 1.0, 1.0);\n"
    ;
    break;
  case TARGET_3D:
  case TARGET_2D_ARRAY:
  case TARGET_2D_MS_ARRAY:
    lVar23 = 0x7a;
    pcVar25 = 
    "\thighp ivec2 screenpos = ivec2(floor(gl_FragCoord.xy));\n\tfragColor = texelFetch(u_sampler, ivec3(screenpos, u_layer), 0);\n"
    ;
    break;
  case TARGET_1D_ARRAY:
    lVar23 = 0x7c;
    pcVar25 = 
    "\thighp ivec2 screenpos = ivec2(floor(gl_FragCoord.xy));\n\tfragColor = texelFetch(u_sampler, ivec2(screenpos.x, u_layer), 0);\n"
    ;
    break;
  default:
    goto switchD_003a9736_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar25,lVar23);
switchD_003a9736_default:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&__dnew_2,"}\n",2);
  std::__cxx11::stringbuf::str();
  specializeShader(&local_388,(string *)&maxSamples,(ContextType *)&section);
  if (_maxSamples != local_330 + 8) {
    operator_delete(_maxSamples,local_330._8_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__dnew_2);
  std::ios_base::~ios_base(local_258);
  numSamples = 1;
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_360,local_388._M_dataplus._M_p,
             local_388._M_dataplus._M_p + local_388._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(&__dnew + (ulong)(uint)numSamples * 3),&local_360);
  glu::ShaderProgram::ShaderProgram(pSVar13,pRVar4,(ProgramSources *)&__dnew);
  this->m_samplerShader = pSVar13;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_2f0._M_dataplus._M_p._4_4_,(int)local_2f0._M_dataplus._M_p) !=
      &local_2f0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_2f0._M_dataplus._M_p._4_4_,(int)local_2f0._M_dataplus._M_p),
                    local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != paVar2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_70);
  lVar23 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&__dnew + lVar23));
    lVar23 = lVar23 + -0x18;
  } while (lVar23 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_samplerShader);
  if ((this->m_samplerShader->m_program).m_info.linkOk == false) {
    pTVar20 = (TestError *)__cxa_allocate_exception(0x38);
    __dnew_2 = (size_type)local_2b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&__dnew_2,"failed to build sampler shader","");
    tcu::TestError::TestError(pTVar20,(string *)&__dnew_2);
    __cxa_throw(pTVar20,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  iVar9 = (**(code **)(CONCAT44(extraout_var_01,iVar9) + 0xb48))
                    ((this->m_samplerShader->m_program).m_program,"u_sampler");
  this->m_samplerSamplerLoc = iVar9;
  if (iVar9 == -1) {
    pTVar20 = (TestError *)__cxa_allocate_exception(0x38);
    __dnew_2 = (size_type)local_2b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&__dnew_2,"u_sampler uniform location = -1","");
    tcu::TestError::TestError(pTVar20,(string *)&__dnew_2);
    __cxa_throw(pTVar20,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  iVar9 = (**(code **)(CONCAT44(extraout_var_02,iVar9) + 0xb48))
                    ((this->m_samplerShader->m_program).m_program,"u_layer");
  this->m_samplerLayerLoc = iVar9;
  if (iVar9 != -1) {
    tcu::TestLog::endSection(section_1.m_log);
    return extraout_EAX;
  }
  pTVar20 = (TestError *)__cxa_allocate_exception(0x38);
  __dnew_2 = (size_type)local_2b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&__dnew_2,"u_layer uniform location = -1","");
  tcu::TestError::TestError(pTVar20,(string *)&__dnew_2);
  __cxa_throw(pTVar20,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void LayeredRenderCase::init (void)
{
	// Requirements

	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
		TCU_THROW(NotSupportedError, "Tests require GL_EXT_geometry_shader extension or higher context version.");

	if (m_target == TARGET_2D_MS_ARRAY && !glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
		TCU_THROW(NotSupportedError, "Test requires OES_texture_storage_multisample_2d_array extension or higher context version.");

	if (m_context.getRenderTarget().getWidth() < m_resolveDimensions.x() || m_context.getRenderTarget().getHeight() < m_resolveDimensions.y())
		throw tcu::NotSupportedError("Render target size must be at least " + de::toString(m_resolveDimensions.x()) + "x" + de::toString(m_resolveDimensions.y()));

	// log what the test tries to do

	if (m_test == TEST_DEFAULT_LAYER)
		m_testCtx.getLog() << tcu::TestLog::Message << "Rendering to the default layer." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_SINGLE_LAYER)
		m_testCtx.getLog() << tcu::TestLog::Message << "Rendering to a single layer." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_ALL_LAYERS)
		m_testCtx.getLog() << tcu::TestLog::Message << "Rendering to all layers." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_DIFFERENT_LAYERS)
		m_testCtx.getLog() << tcu::TestLog::Message << "Outputting different number of vertices to each layer." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_INVOCATION_PER_LAYER)
		m_testCtx.getLog() << tcu::TestLog::Message << "Using a different invocation to output to each layer." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_MULTIPLE_LAYERS_PER_INVOCATION)
		m_testCtx.getLog() << tcu::TestLog::Message << "Outputting to each layer from multiple invocations." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_LAYER_ID)
		m_testCtx.getLog() << tcu::TestLog::Message << "Using gl_Layer in fragment shader." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_LAYER_PROVOKING_VERTEX)
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying LAYER_PROVOKING_VERTEX." << tcu::TestLog::EndMessage;
	else
		DE_ASSERT(false);

	// init resources

	initTexture();
	initFbo();
	initRenderShader();
	initSamplerShader();
}